

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void update_stats(AV1_COMMON *cm,ThreadData_conflict *td)

{
  aom_cdf_prob *paVar1;
  BLOCK_SIZE BVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *fc;
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *pMVar9;
  scale_factors *psVar10;
  FRAME_CONTEXT *pFVar11;
  short sVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  byte bVar18;
  char cVar19;
  byte bVar20;
  MvSubpelPrecision precision;
  uint uVar21;
  ulong uVar22;
  MV_REFERENCE_FRAME *rf;
  long lVar23;
  MV *mv;
  byte bVar24;
  undefined8 unaff_RBP;
  undefined7 uVar25;
  ulong uVar26;
  aom_cdf_prob (*cdf) [4];
  aom_cdf_prob (*paaVar27) [3];
  ulong uVar28;
  MACROBLOCKD *xd;
  bool bVar29;
  MOTION_MODE val;
  int_mv dv_ref;
  int_mv local_54;
  MACROBLOCKD *local_50;
  ulong local_48;
  MV_REFERENCE_FRAME *local_40;
  ulong local_38;
  
  mbmi = *(td->mb).e_mbd.mi;
  uVar28 = (ulong)mbmi->bsize;
  uVar4 = *(ushort *)&mbmi->field_0xa7;
  uVar26 = (ulong)uVar4;
  if ((cm->seg).enabled == '\0') {
    bVar24 = 0;
    uVar25 = 0;
  }
  else {
    uVar22 = CONCAT71((int7)((ulong)unaff_RBP >> 8),(char)(cm->seg).feature_mask[(byte)uVar4 & 7]) &
             0xffffffffffffff20;
    uVar25 = (undefined7)(uVar22 >> 8);
    bVar24 = (byte)uVar22 >> 5;
  }
  fc = (td->mb).e_mbd.tile_ctx;
  if (((cm->current_frame).skip_mode_info.skip_mode_flag != 0) && (bVar24 == 0)) {
    bVar18 = block_size_high[uVar28];
    if (block_size_wide[uVar28] < block_size_high[uVar28]) {
      bVar18 = block_size_wide[uVar28];
    }
    if (7 < bVar18) {
      pMVar8 = (td->mb).e_mbd.left_mbmi;
      pMVar9 = (td->mb).e_mbd.above_mbmi;
      if (pMVar9 == (MB_MODE_INFO *)0x0) {
        uVar26 = 0;
      }
      else {
        uVar26 = (ulong)(*(ushort *)&pMVar9->field_0xa7 >> 6 & 1);
      }
      if (pMVar8 == (MB_MODE_INFO *)0x0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (ulong)(*(ushort *)&pMVar8->field_0xa7 >> 6 & 1);
      }
      lVar23 = uVar22 + uVar26;
      uVar5 = fc->skip_mode_cdfs[lVar23][2];
      bVar18 = (char)(uVar5 >> 4) + 4;
      uVar6 = fc->skip_mode_cdfs[lVar23][0];
      if ((uVar4 & 0x40) == 0) {
        sVar12 = -(uVar6 >> (bVar18 & 0x1f));
      }
      else {
        sVar12 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar18 & 0x1f));
      }
      fc->skip_mode_cdfs[lVar23][0] = uVar6 + sVar12;
      fc->skip_mode_cdfs[lVar23][2] = uVar5 + (uVar5 < 0x20);
      uVar26 = (ulong)*(ushort *)&mbmi->field_0xa7;
    }
  }
  cVar19 = (char)uVar26;
  if ((uVar26 >> 6 & 1) == 0 && bVar24 == 0) {
    pMVar8 = (td->mb).e_mbd.left_mbmi;
    pMVar9 = (td->mb).e_mbd.above_mbmi;
    if (pMVar9 == (MB_MODE_INFO *)0x0) {
      uVar26 = 0;
    }
    else {
      uVar26 = (ulong)pMVar9->skip_txfm;
    }
    if (pMVar8 == (MB_MODE_INFO *)0x0) {
      uVar22 = 0;
    }
    else {
      uVar22 = (ulong)pMVar8->skip_txfm;
    }
    lVar23 = uVar22 + uVar26;
    uVar4 = fc->skip_txfm_cdfs[lVar23][2];
    bVar18 = (char)(uVar4 >> 4) + 4;
    uVar5 = fc->skip_txfm_cdfs[lVar23][0];
    if ((char)mbmi->skip_txfm < '\x01') {
      sVar12 = -(uVar5 >> (bVar18 & 0x1f));
    }
    else {
      sVar12 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar18 & 0x1f));
    }
    fc->skip_txfm_cdfs[lVar23][0] = sVar12 + uVar5;
    fc->skip_txfm_cdfs[lVar23][2] = uVar4 + (uVar4 < 0x20);
    cVar19 = (char)*(undefined2 *)&mbmi->field_0xa7;
  }
  xd = &(td->mb).e_mbd;
  if ((-1 < cVar19) && (mbmi->ref_frame[0] < '\x01')) {
    av1_sum_intra_stats(cm,td->counts,xd,mbmi,(td->mb).e_mbd.above_mbmi,(td->mb).e_mbd.left_mbmi,
                        (uint)(((cm->current_frame).frame_type & 0xfd) == 0));
  }
  if (((cm->current_frame).frame_type & 0xfd) == 0) {
    if ((cm->features).allow_screen_content_tools != true) {
      return;
    }
    if ((cm->features).allow_intrabc == false) {
      return;
    }
    uVar4 = fc->intrabc_cdf[2];
    bVar18 = (char)(uVar4 >> 4) + 4;
    uVar5 = fc->intrabc_cdf[0];
    if ((mbmi->field_0xa7 & 0x80) == 0) {
      fc->intrabc_cdf[0] = uVar5 - (uVar5 >> (bVar18 & 0x1f));
      fc->intrabc_cdf[2] = uVar4 + (uVar4 < 0x20);
      return;
    }
    fc->intrabc_cdf[0] = (short)((int)(0x8000 - (uint)uVar5) >> (bVar18 & 0x1f)) + uVar5;
    fc->intrabc_cdf[2] = uVar4 + (uVar4 < 0x20);
    cVar19 = mbmi->ref_frame[0];
    bVar18 = mbmi->ref_frame[1];
    if ('\0' < (char)bVar18) {
      if (bVar18 < 5 || '\x04' < cVar19) {
        lVar23 = 0;
        do {
          if ((cVar19 == (&comp_ref0_lut)[lVar23]) && (bVar18 == (&comp_ref1_lut)[lVar23])) {
            cVar19 = (char)lVar23 + '\x14';
            goto LAB_001f1ed5;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 9);
      }
      cVar19 = bVar18 * '\x04' + cVar19 + -0xd;
    }
LAB_001f1ed5:
    local_54 = *(int_mv *)((td->mb).mbmi_ext.ref_mv_stack + cVar19);
    av1_update_mv_stats(&mbmi->mv[0].as_mv,&local_54.as_mv,&fc->ndvc,-1);
    if (((cm->current_frame).frame_type & 0xfd) == 0) {
      return;
    }
  }
  if ((*(ushort *)&mbmi->field_0xa7 & 0x40) != 0) {
    return;
  }
  local_40 = (MV_REFERENCE_FRAME *)td->counts;
  if ((char)*(ushort *)&mbmi->field_0xa7 < '\0') {
    if (bVar24 == 0) {
      bVar29 = false;
      goto LAB_001f1c46;
    }
  }
  else {
    bVar29 = mbmi->ref_frame[0] < '\x01';
    if (bVar24 == 0) {
LAB_001f1c46:
      iVar16 = av1_get_intra_inter_context(xd);
      paaVar27 = fc->intra_inter_cdf + iVar16;
      uVar4 = fc->intra_inter_cdf[iVar16][2];
      bVar24 = (char)(uVar4 >> 4) + 4;
      uVar5 = (*paaVar27)[0];
      if (bVar29) {
        (*paaVar27)[0] = uVar5 - (uVar5 >> (bVar24 & 0x1f));
        fc->intra_inter_cdf[iVar16][2] = uVar4 + (uVar4 < 0x20);
        return;
      }
      (*paaVar27)[0] = (short)((int)(0x8000 - (uint)uVar5) >> (bVar24 & 0x1f)) + uVar5;
      fc->intra_inter_cdf[iVar16][2] = uVar4 + (uVar4 < 0x20);
      bVar24 = mbmi->ref_frame[0];
      bVar18 = mbmi->ref_frame[1];
      uVar26 = CONCAT71(uVar25,bVar18);
      local_38 = uVar28;
      if ((cm->current_frame).reference_mode == '\x02') {
        bVar20 = block_size_high[uVar28];
        if (block_size_wide[uVar28] < block_size_high[uVar28]) {
          bVar20 = block_size_wide[uVar28];
        }
        if (7 < bVar20) {
          pFVar11 = (td->mb).e_mbd.tile_ctx;
          iVar16 = av1_get_reference_mode_context(xd);
          update_cdf(pFVar11->comp_inter_cdf[iVar16],'\0' < mbmi->ref_frame[1],2);
          bVar18 = mbmi->ref_frame[1];
        }
      }
      if ((char)bVar18 < '\x01') {
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        local_50 = xd;
        iVar16 = av1_get_pred_context_single_ref_p1(xd);
        update_cdf((aom_cdf_prob *)(pFVar11->single_ref_cdf + iVar16),'\x04' < (char)bVar24,2);
        xd = local_50;
        if ((char)bVar24 < '\x05') {
          pFVar11 = (td->mb).e_mbd.tile_ctx;
          local_48 = (ulong)bVar24;
          iVar16 = av1_get_pred_context_single_ref_p3(local_50);
          update_cdf(pFVar11->single_ref_cdf[iVar16][2],(byte)(bVar24 - 3) < 0xfe,2);
          xd = local_50;
          pFVar11 = (td->mb).e_mbd.tile_ctx;
          if ((byte)(bVar24 - 3) < 0xfe) {
            iVar16 = av1_get_pred_context_single_ref_p5(local_50);
            paaVar27 = pFVar11->single_ref_cdf[iVar16] + 4;
            bVar29 = (char)local_48 == '\x03';
          }
          else {
            iVar16 = av1_get_pred_context_single_ref_p4(local_50);
            paaVar27 = pFVar11->single_ref_cdf[iVar16] + 3;
            bVar29 = (char)local_48 == '\x01';
          }
          bVar29 = !bVar29;
LAB_001f21b0:
          update_cdf(*paaVar27,bVar29,2);
        }
        else {
          pFVar11 = (td->mb).e_mbd.tile_ctx;
          iVar16 = av1_get_pred_context_single_ref_p2(local_50);
          update_cdf(pFVar11->single_ref_cdf[iVar16][1],bVar24 == 7,2);
          if (bVar24 != 7) {
            pFVar11 = (td->mb).e_mbd.tile_ctx;
            iVar16 = av1_get_pred_context_single_ref_p6(xd);
            paaVar27 = pFVar11->single_ref_cdf[iVar16] + 5;
            goto LAB_001f2186;
          }
        }
      }
      else {
        cVar19 = mbmi->ref_frame[0];
        local_48 = uVar26;
        iVar16 = av1_get_comp_reference_type_context(xd);
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        paaVar27 = pFVar11->comp_ref_type_cdf + iVar16;
        uVar4 = pFVar11->comp_ref_type_cdf[iVar16][2];
        bVar20 = (char)(uVar4 >> 4) + 4;
        uVar5 = (*paaVar27)[0];
        if (bVar18 < 5 == '\x04' < cVar19) {
          (*paaVar27)[0] = (short)((int)(0x8000 - (uint)uVar5) >> (bVar20 & 0x1f)) + uVar5;
          pFVar11->comp_ref_type_cdf[iVar16][2] = uVar4 + (uVar4 < 0x20);
          local_50 = xd;
          iVar16 = av1_get_pred_context_comp_ref_p(xd);
          update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar16),
                     (byte)(bVar24 - 3) < 2,2);
          if ((byte)(bVar24 - 3) < 2) {
            bVar29 = bVar24 == 4;
            iVar16 = av1_get_pred_context_comp_ref_p2(local_50);
            paaVar27 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar16] + 2;
          }
          else {
            iVar16 = av1_get_pred_context_comp_ref_p1(local_50);
            paaVar27 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar16] + 1;
            bVar29 = bVar24 == 2;
          }
          update_cdf(*paaVar27,bVar29,2);
          xd = local_50;
          iVar16 = av1_get_pred_context_comp_bwdref_p(local_50);
          bVar24 = (byte)local_48;
          update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar16),
                     bVar24 == 7,2);
          if (bVar24 != 7) {
            iVar16 = av1_get_pred_context_comp_bwdref_p1(xd);
            paaVar27 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar16] + 1;
LAB_001f2186:
            bVar29 = bVar24 == 6;
            goto LAB_001f21b0;
          }
        }
        else {
          (*paaVar27)[0] = uVar5 - (uVar5 >> (bVar20 & 0x1f));
          pFVar11->comp_ref_type_cdf[iVar16][2] = uVar4 + (uVar4 < 0x20);
          iVar16 = av1_get_pred_context_uni_comp_ref_p(xd);
          update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar16),
                     bVar24 == 5,2);
          if (bVar24 != 5) {
            bVar24 = (char)local_48 - 3;
            iVar16 = av1_get_pred_context_uni_comp_ref_p1(xd);
            uVar26 = local_48;
            update_cdf(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar16][1],bVar24 < 2,2);
            if (bVar24 < 2) {
              bVar29 = (char)uVar26 == '\x04';
              iVar16 = av1_get_pred_context_uni_comp_ref_p2(xd);
              paaVar27 = ((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar16] + 2;
              goto LAB_001f21b0;
            }
          }
        }
      }
      uVar26 = local_38;
      iVar16 = (int)local_38;
      if ((((cm->seq_params->enable_interintra_compound != '\0') &&
           (0xf8 < (byte)(mbmi->bsize - BLOCK_32X64))) && (0xfb < (byte)(mbmi->mode - 0x11))) &&
         (('\0' < mbmi->ref_frame[0] && (mbmi->ref_frame[1] < '\x01')))) {
        bVar24 = ""[local_38];
        if (mbmi->ref_frame[1] == '\0') {
          update_cdf(fc->interintra_cdf[bVar24],'\x01',2);
          update_cdf(fc->interintra_mode_cdf[bVar24],mbmi->interintra_mode,4);
          if ((0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                           (ulong)(uint)(iVar16 << 5))) &&
             (update_cdf(fc->wedge_interintra_cdf[uVar26],
                         (byte)((ushort)*(undefined2 *)&mbmi->field_0xa7 >> 10) & 1,2),
             (mbmi->field_0xa8 & 4) != 0)) {
            update_cdf((aom_cdf_prob *)
                       ((long)fc->wedge_idx_cdf[0] + (ulong)(uint)(iVar16 << 5) + uVar26 * 2),
                       mbmi->interintra_wedge_index,0x10);
          }
        }
        else {
          update_cdf(fc->interintra_cdf[bVar24],'\0',2);
        }
      }
      iVar14 = 0;
      iVar15 = iVar14;
      if (((cm->features).switchable_motion_mode == true) &&
         (iVar15 = 0, mbmi->overlappable_neighbors != '\0')) {
        iVar7 = (td->mb).e_mbd.cur_frame_force_integer_mv;
        BVar2 = mbmi->bsize;
        if (iVar7 == 0) {
          bVar24 = block_size_high[BVar2];
          if (block_size_wide[BVar2] < block_size_high[BVar2]) {
            bVar24 = block_size_wide[BVar2];
          }
          if (((1 < (td->mb).e_mbd.global_motion[mbmi->ref_frame[0]].wmtype) &&
              ((mbmi->mode - 0xf & 0xf7) == 0)) && (iVar15 = iVar14, 7 < bVar24)) goto LAB_001f22dd;
        }
        else {
          bVar24 = block_size_high[BVar2];
          if (block_size_wide[BVar2] < block_size_high[BVar2]) {
            bVar24 = block_size_wide[BVar2];
          }
        }
        iVar15 = 0;
        if ((bVar24 < 8) || (iVar15 = iVar14, (byte)(mbmi->mode - 0x19) < 0xf4)) goto LAB_001f22dd;
        cVar19 = mbmi->ref_frame[1];
        iVar15 = 0;
        if (cVar19 < '\0') {
          if (((iVar7 == 0) && ((cm->features).allow_warped_motion != false)) &&
             (mbmi->num_proj_ref != '\0')) {
            psVar10 = (td->mb).e_mbd.block_ref_scale_factors[0];
            iVar14 = psVar10->x_scale_fp;
            iVar15 = 2;
            if (((iVar14 == -1) || (iVar7 = psVar10->y_scale_fp, iVar7 == -1)) ||
               (iVar7 == 0x4000 && iVar14 == 0x4000)) goto LAB_001f22dd;
          }
          iVar15 = 1;
          goto LAB_001f22dd;
        }
      }
      else {
LAB_001f22dd:
        cVar19 = mbmi->ref_frame[1];
      }
      if (cVar19 != '\0') {
        if (iVar15 == 1) {
          cdf = (aom_cdf_prob (*) [4])(fc->obmc_cdf + uVar26);
          val = mbmi->motion_mode == '\x01';
          iVar15 = 2;
        }
        else {
          if (iVar15 != 2) goto LAB_001f233f;
          cdf = fc->motion_mode_cdf + uVar26;
          val = mbmi->motion_mode;
          iVar15 = 3;
        }
        update_cdf(*cdf,val,iVar15);
      }
LAB_001f233f:
      if ('\0' < mbmi->ref_frame[1]) {
        bVar24 = block_size_high[uVar26];
        if (block_size_wide[uVar26] < block_size_high[uVar26]) {
          bVar24 = block_size_wide[uVar26];
        }
        if (bVar24 < 8) {
          bVar18 = (byte)(*(ushort *)&mbmi->field_0xa7 >> 8);
          if ((*(ushort *)&mbmi->field_0xa7 >> 8 & 1) != 0) goto LAB_001f241b;
LAB_001f23e3:
          uVar21 = get_comp_index_context(cm,xd);
          paaVar27 = fc->compound_index_cdf + uVar21;
          bVar24 = bVar18 >> 1 & 1;
        }
        else {
          if (cm->seq_params->enable_masked_compound != '\0') {
            uVar21 = get_comp_group_idx_context((MACROBLOCKD *)(td->mb).e_mbd.left_mbmi);
            update_cdf(fc->comp_group_idx_cdf[uVar21],mbmi->field_0xa8 & 1,2);
          }
          bVar18 = (byte)(*(ushort *)&mbmi->field_0xa7 >> 8);
          if ((*(ushort *)&mbmi->field_0xa7 >> 8 & 1) == 0) goto LAB_001f23e3;
          if ((bVar24 < 8) ||
             (*(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar16 << 5)) <
              1)) goto LAB_001f241b;
          paaVar27 = fc->compound_type_cdf + uVar26;
          bVar24 = (mbmi->interinter_comp).type - 2;
        }
        update_cdf(*paaVar27,bVar24,2);
      }
LAB_001f241b:
      if ((mbmi->interinter_comp).type == '\x02') {
        bVar24 = block_size_high[uVar26];
        if (block_size_wide[uVar26] < block_size_high[uVar26]) {
          bVar24 = block_size_wide[uVar26];
        }
        if ((7 < bVar24) &&
           (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar16 << 5))
           )) {
          update_cdf((aom_cdf_prob *)
                     ((long)fc->wedge_idx_cdf[0] + (ulong)(uint)(iVar16 << 5) + uVar26 * 2),
                     (mbmi->interinter_comp).wedge_index,0x10);
        }
      }
    }
    else if (mbmi->ref_frame[0] < '\x01') {
      return;
    }
  }
  if ((((cm->features).interp_filter == MULTITAP_SHARP2) &&
      (pMVar8 = *(td->mb).e_mbd.mi, (pMVar8->field_0xa7 & 0x40) == 0)) &&
     (pMVar8->motion_mode != '\x02')) {
    if ((pMVar8->mode == '\x17') || (pMVar8->mode == '\x0f')) {
      bVar24 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar8->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar8->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar8->bsize]) {
        bVar24 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar8->bsize];
      }
      if (1 < bVar24) {
        bVar24 = 1;
        lVar23 = 0;
        do {
          if ((td->mb).e_mbd.global_motion[pMVar8->ref_frame[lVar23]].wmtype == '\x01')
          goto LAB_001f24ea;
          bVar18 = ~bVar24;
          lVar23 = 1;
          bVar24 = 0;
        } while (!(bool)(bVar18 & 1) && '\0' < pMVar8->ref_frame[1]);
        goto LAB_001f2699;
      }
    }
LAB_001f24ea:
    uVar3 = cm->seq_params->enable_dual_filter;
    iVar16 = 0;
    bVar29 = true;
    do {
      bVar13 = bVar29;
      if ((bool)(uVar3 == '\0' & (bVar13 ^ 1U))) break;
      iVar16 = av1_get_pred_context_switchable_interp(xd,iVar16);
      uVar21 = (mbmi->interp_filters).as_int >> 0x10;
      if (bVar13) {
        uVar21 = (mbmi->interp_filters).as_int;
      }
      pFVar11 = (td->mb).e_mbd.tile_ctx;
      uVar4 = pFVar11->switchable_interp_cdf[iVar16][3];
      bVar24 = (char)(uVar4 >> 4) + 4;
      lVar23 = 0;
      do {
        uVar5 = pFVar11->switchable_interp_cdf[iVar16][lVar23];
        if (lVar23 < (char)uVar21) {
          sVar12 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar24 & 0x1f));
        }
        else {
          sVar12 = -(uVar5 >> (bVar24 & 0x1f));
        }
        pFVar11->switchable_interp_cdf[iVar16][lVar23] = sVar12 + uVar5;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 2);
      paVar1 = pFVar11->switchable_interp_cdf[iVar16] + 3;
      *paVar1 = *paVar1 + (ushort)(uVar4 < 0x20);
      iVar16 = 1;
      bVar29 = false;
    } while (bVar13);
  }
LAB_001f2699:
  if (((cm->seg).enabled != '\0') &&
     (((cm->seg).feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) != 0)) {
    return;
  }
  bVar24 = mbmi->ref_frame[1];
  cVar19 = mbmi->ref_frame[0];
  if ((char)bVar24 < '\x01') {
    av1_update_inter_mode_stats
              (fc,(FRAME_COUNTS *)local_40,mbmi->mode,(td->mb).mbmi_ext.mode_context[cVar19]);
  }
  else {
    if ('\x04' < cVar19 || bVar24 < 5) {
      lVar23 = 0;
      do {
        if (((&comp_ref0_lut)[lVar23] == cVar19) && ((&comp_ref1_lut)[lVar23] == bVar24)) {
          cVar19 = (char)lVar23 + '\x14';
          goto LAB_001f2718;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 9);
    }
    cVar19 = bVar24 * '\x04' + cVar19 + -0xd;
LAB_001f2718:
    uVar4 = (td->mb).mbmi_ext.mode_context[cVar19];
    uVar21 = uVar4 & 7;
    uVar26 = 4;
    if ((ushort)uVar21 < 4) {
      uVar26 = (ulong)uVar21;
    }
    update_cdf(fc->inter_compound_mode_cdf[(short)compound_mode_ctx_map[uVar4 >> 5 & 7][uVar26]],
               mbmi->mode + 0xef,8);
  }
  bVar24 = mbmi->mode;
  if (0x18 < bVar24) {
    return;
  }
  rf = mbmi->ref_frame;
  uVar21 = (uint)bVar24;
  if ((0x644000U >> (bVar24 & 0x1f) & 1) == 0) {
    if ((0x180000U >> (uVar21 & 0x1f) & 1) != 0) goto LAB_001f29e7;
    if ((0x1010000U >> (uVar21 & 0x1f) & 1) == 0) {
      return;
    }
    local_40 = rf;
    bVar18 = av1_ref_frame_type(rf);
    uVar26 = 0;
    bVar29 = true;
    do {
      while (bVar13 = bVar29, uVar26 + 1 < (ulong)(td->mb).mbmi_ext.ref_mv_count[bVar18]) {
        bVar29 = (td->mb).mbmi_ext.weight[bVar18][uVar26 + 1] < 0x280;
        uVar28 = (ulong)((uint)bVar29 * 2);
        if (0x27f < (td->mb).mbmi_ext.weight[bVar18][uVar26]) {
          uVar28 = (ulong)bVar29;
        }
        uVar4 = fc->drl_cdf[uVar28][2];
        bVar20 = (char)(uVar4 >> 4) + 4;
        uVar5 = fc->drl_cdf[uVar28][0];
        if (uVar26 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) {
          sVar12 = -(uVar5 >> (bVar20 & 0x1f));
        }
        else {
          sVar12 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar20 & 0x1f));
        }
        fc->drl_cdf[uVar28][0] = uVar5 + sVar12;
        fc->drl_cdf[uVar28][2] = uVar4 + (uVar4 < 0x20);
        uVar26 = 1;
        bVar29 = false;
        if (!(bool)(bVar13 & (mbmi->field_0xa7 & 0x30) != 0)) goto LAB_001f28c4;
      }
      uVar26 = 1;
      bVar29 = false;
    } while (bVar13);
LAB_001f28c4:
    if (0x18 < uVar21) {
      return;
    }
    rf = local_40;
    if ((0x644000U >> (uVar21 & 0x1f) & 1) != 0) goto LAB_001f28e6;
    uVar17 = 0x1190000;
  }
  else {
LAB_001f28e6:
    bVar18 = av1_ref_frame_type(rf);
    uVar26 = 0;
    do {
      while (uVar28 = uVar26 + 1, uVar26 + 2 < (ulong)(td->mb).mbmi_ext.ref_mv_count[bVar18]) {
        bVar29 = (td->mb).mbmi_ext.weight[bVar18][uVar26 + 2] < 0x280;
        uVar22 = (ulong)((uint)bVar29 * 2);
        if (0x27f < (td->mb).mbmi_ext.weight[bVar18][uVar26 + 1]) {
          uVar22 = (ulong)bVar29;
        }
        uVar4 = fc->drl_cdf[uVar22][2];
        bVar20 = (char)(uVar4 >> 4) + 4;
        uVar5 = fc->drl_cdf[uVar22][0];
        if (uVar26 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) {
          sVar12 = -(uVar5 >> (bVar20 & 0x1f));
        }
        else {
          sVar12 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar20 & 0x1f));
        }
        fc->drl_cdf[uVar22][0] = uVar5 + sVar12;
        fc->drl_cdf[uVar22][2] = uVar4 + (uVar4 < 0x20);
        if ((uVar26 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) || (uVar26 = uVar28, 1 < uVar28))
        goto LAB_001f29d0;
      }
      uVar26 = uVar28;
    } while (uVar28 < 2);
LAB_001f29d0:
    if (0x18 < bVar24) {
      return;
    }
    uVar17 = 0x1790000;
  }
  if ((uVar17 >> (bVar24 & 0x1f) & 1) == 0) {
    return;
  }
LAB_001f29e7:
  precision = -1;
  if ((cm->features).cur_frame_force_integer_mv == false) {
    precision = (cm->features).allow_high_precision_mv;
  }
  if (uVar21 < 0x19) {
    if ((0x280000U >> (uVar21 & 0x1f) & 1) == 0) {
      if ((0x500000U >> (uVar21 & 0x1f) & 1) == 0) {
        if ((0x1010000U >> (uVar21 & 0x1f) & 1) == 0) {
          return;
        }
        bVar29 = true;
        lVar23 = 0;
        do {
          local_54 = av1_get_ref_mv(&td->mb,(int)lVar23);
          av1_update_mv_stats((MV *)(mbmi->mv + lVar23),&local_54.as_mv,&fc->nmvc,precision);
          if (!bVar29) {
            return;
          }
          lVar23 = 1;
          bVar29 = false;
        } while ('\0' < mbmi->ref_frame[1]);
        return;
      }
      local_54 = av1_get_ref_mv(&td->mb,0);
      mv = (MV *)mbmi->mv;
    }
    else {
      local_54 = av1_get_ref_mv(&td->mb,1);
      mv = (MV *)(mbmi->mv + 1);
    }
    av1_update_mv_stats(mv,&local_54.as_mv,&fc->nmvc,precision);
  }
  return;
}

Assistant:

static void update_stats(const AV1_COMMON *const cm, ThreadData *td) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const CurrentFrame *const current_frame = &cm->current_frame;
  const BLOCK_SIZE bsize = mbmi->bsize;
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const int seg_ref_active =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);

  if (current_frame->skip_mode_info.skip_mode_flag && !seg_ref_active &&
      is_comp_ref_allowed(bsize)) {
    const int skip_mode_ctx = av1_get_skip_mode_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_mode[skip_mode_ctx][mbmi->skip_mode]++;
#endif
    update_cdf(fc->skip_mode_cdfs[skip_mode_ctx], mbmi->skip_mode, 2);
  }

  if (!mbmi->skip_mode && !seg_ref_active) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_txfm[skip_ctx][mbmi->skip_txfm]++;
#endif
    update_cdf(fc->skip_txfm_cdfs[skip_ctx], mbmi->skip_txfm, 2);
  }

#if CONFIG_ENTROPY_STATS
  // delta quant applies to both intra and inter
  const int super_block_upper_left =
      ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
      ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  if (delta_q_info->delta_q_present_flag &&
      (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
      super_block_upper_left) {
    const int dq = (mbmi->current_qindex - xd->current_base_qindex) /
                   delta_q_info->delta_q_res;
    const int absdq = abs(dq);
    for (int i = 0; i < AOMMIN(absdq, DELTA_Q_SMALL); ++i) {
      td->counts->delta_q[i][1]++;
    }
    if (absdq < DELTA_Q_SMALL) td->counts->delta_q[absdq][0]++;
    if (delta_q_info->delta_lf_present_flag) {
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int delta_lf = (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                               delta_q_info->delta_lf_res;
          const int abs_delta_lf = abs(delta_lf);
          for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
            td->counts->delta_lf_multi[lf_id][i][1]++;
          }
          if (abs_delta_lf < DELTA_LF_SMALL)
            td->counts->delta_lf_multi[lf_id][abs_delta_lf][0]++;
        }
      } else {
        const int delta_lf =
            (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
            delta_q_info->delta_lf_res;
        const int abs_delta_lf = abs(delta_lf);
        for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
          td->counts->delta_lf[i][1]++;
        }
        if (abs_delta_lf < DELTA_LF_SMALL)
          td->counts->delta_lf[abs_delta_lf][0]++;
      }
    }
  }
#endif

  if (!is_inter_block(mbmi)) {
    av1_sum_intra_stats(cm, td->counts, xd, mbmi, xd->above_mbmi, xd->left_mbmi,
                        frame_is_intra_only(cm));
  }

  if (av1_allow_intrabc(cm)) {
    const int is_intrabc = is_intrabc_block(mbmi);
    update_cdf(fc->intrabc_cdf, is_intrabc, 2);
#if CONFIG_ENTROPY_STATS
    ++td->counts->intrabc[is_intrabc];
#endif  // CONFIG_ENTROPY_STATS
    if (is_intrabc) {
      const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      const int_mv dv_ref = mbmi_ext->ref_mv_stack[ref_frame_type][0].this_mv;
      av1_update_mv_stats(&mbmi->mv[0].as_mv, &dv_ref.as_mv, &fc->ndvc,
                          MV_SUBPEL_NONE);
    }
  }

  if (frame_is_intra_only(cm) || mbmi->skip_mode) return;

  FRAME_COUNTS *const counts = td->counts;
  const int inter_block = is_inter_block(mbmi);

  if (!seg_ref_active) {
#if CONFIG_ENTROPY_STATS
    counts->intra_inter[av1_get_intra_inter_context(xd)][inter_block]++;
#endif
    update_cdf(fc->intra_inter_cdf[av1_get_intra_inter_context(xd)],
               inter_block, 2);
    // If the segment reference feature is enabled we have only a single
    // reference frame allowed for the segment so exclude it from
    // the reference frame counts used to work out probabilities.
    if (inter_block) {
      const MV_REFERENCE_FRAME ref0 = mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME ref1 = mbmi->ref_frame[1];
      if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
        if (is_comp_ref_allowed(bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->comp_inter[av1_get_reference_mode_context(xd)]
                            [has_second_ref(mbmi)]++;
#endif  // CONFIG_ENTROPY_STATS
          update_cdf(av1_get_reference_mode_cdf(xd), has_second_ref(mbmi), 2);
        }
      }

      if (has_second_ref(mbmi)) {
        const COMP_REFERENCE_TYPE comp_ref_type = has_uni_comp_refs(mbmi)
                                                      ? UNIDIR_COMP_REFERENCE
                                                      : BIDIR_COMP_REFERENCE;
        update_cdf(av1_get_comp_reference_type_cdf(xd), comp_ref_type,
                   COMP_REFERENCE_TYPES);
#if CONFIG_ENTROPY_STATS
        counts->comp_ref_type[av1_get_comp_reference_type_context(xd)]
                             [comp_ref_type]++;
#endif  // CONFIG_ENTROPY_STATS

        if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
          const int bit = (ref0 == BWDREF_FRAME);
          update_cdf(av1_get_pred_cdf_uni_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts
              ->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            const int bit1 = (ref1 == LAST3_FRAME || ref1 == GOLDEN_FRAME);
            update_cdf(av1_get_pred_cdf_uni_comp_ref_p1(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
            counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p1(xd)][1]
                                [bit1]++;
#endif  // CONFIG_ENTROPY_STATS
            if (bit1) {
              update_cdf(av1_get_pred_cdf_uni_comp_ref_p2(xd),
                         ref1 == GOLDEN_FRAME, 2);
#if CONFIG_ENTROPY_STATS
              counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p2(xd)][2]
                                  [ref1 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
            }
          }
        } else {
          const int bit = (ref0 == GOLDEN_FRAME || ref0 == LAST3_FRAME);
          update_cdf(av1_get_pred_cdf_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts->comp_ref[av1_get_pred_context_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            update_cdf(av1_get_pred_cdf_comp_ref_p1(xd), ref0 == LAST2_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p1(xd)][1]
                            [ref0 == LAST2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_comp_ref_p2(xd), ref0 == GOLDEN_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p2(xd)][2]
                            [ref0 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
          update_cdf(av1_get_pred_cdf_comp_bwdref_p(xd), ref1 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p(xd)][0]
                             [ref1 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref1 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_comp_bwdref_p1(xd),
                       ref1 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p1(xd)][1]
                               [ref1 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      } else {
        const int bit = (ref0 >= BWDREF_FRAME);
        update_cdf(av1_get_pred_cdf_single_ref_p1(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
        counts->single_ref[av1_get_pred_context_single_ref_p1(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
        if (bit) {
          assert(ref0 <= ALTREF_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p2(xd), ref0 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p2(xd)][1]
                            [ref0 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref0 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_single_ref_p6(xd),
                       ref0 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p6(xd)][5]
                              [ref0 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        } else {
          const int bit1 = !(ref0 == LAST2_FRAME || ref0 == LAST_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p3(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p3(xd)][2][bit1]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit1) {
            update_cdf(av1_get_pred_cdf_single_ref_p4(xd), ref0 != LAST_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p4(xd)][3]
                              [ref0 != LAST_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_single_ref_p5(xd), ref0 != LAST3_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p5(xd)][4]
                              [ref0 != LAST3_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      }

      if (cm->seq_params->enable_interintra_compound &&
          is_interintra_allowed(mbmi)) {
        const int bsize_group = size_group_lookup[bsize];
        if (mbmi->ref_frame[1] == INTRA_FRAME) {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][1]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 1, 2);
#if CONFIG_ENTROPY_STATS
          counts->interintra_mode[bsize_group][mbmi->interintra_mode]++;
#endif
          update_cdf(fc->interintra_mode_cdf[bsize_group],
                     mbmi->interintra_mode, INTERINTRA_MODES);
          if (av1_is_wedge_used(bsize)) {
#if CONFIG_ENTROPY_STATS
            counts->wedge_interintra[bsize][mbmi->use_wedge_interintra]++;
#endif
            update_cdf(fc->wedge_interintra_cdf[bsize],
                       mbmi->use_wedge_interintra, 2);
            if (mbmi->use_wedge_interintra) {
#if CONFIG_ENTROPY_STATS
              counts->wedge_idx[bsize][mbmi->interintra_wedge_index]++;
#endif
              update_cdf(fc->wedge_idx_cdf[bsize], mbmi->interintra_wedge_index,
                         16);
            }
          }
        } else {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][0]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 0, 2);
        }
      }

      const MOTION_MODE motion_allowed =
          cm->features.switchable_motion_mode
              ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                    cm->features.allow_warped_motion)
              : SIMPLE_TRANSLATION;
      if (mbmi->ref_frame[1] != INTRA_FRAME) {
        if (motion_allowed == WARPED_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->motion_mode[bsize][mbmi->motion_mode]++;
#endif
          update_cdf(fc->motion_mode_cdf[bsize], mbmi->motion_mode,
                     MOTION_MODES);
        } else if (motion_allowed == OBMC_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->obmc[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
#endif
          update_cdf(fc->obmc_cdf[bsize], mbmi->motion_mode == OBMC_CAUSAL, 2);
        }
      }

      if (has_second_ref(mbmi)) {
        assert(current_frame->reference_mode != SINGLE_REFERENCE &&
               is_inter_compound_mode(mbmi->mode) &&
               mbmi->motion_mode == SIMPLE_TRANSLATION);

        const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                         cm->seq_params->enable_masked_compound;
        if (masked_compound_used) {
          const int comp_group_idx_ctx = get_comp_group_idx_context(xd);
#if CONFIG_ENTROPY_STATS
          ++counts->comp_group_idx[comp_group_idx_ctx][mbmi->comp_group_idx];
#endif
          update_cdf(fc->comp_group_idx_cdf[comp_group_idx_ctx],
                     mbmi->comp_group_idx, 2);
        }

        if (mbmi->comp_group_idx == 0) {
          const int comp_index_ctx = get_comp_index_context(cm, xd);
#if CONFIG_ENTROPY_STATS
          ++counts->compound_index[comp_index_ctx][mbmi->compound_idx];
#endif
          update_cdf(fc->compound_index_cdf[comp_index_ctx], mbmi->compound_idx,
                     2);
        } else {
          assert(masked_compound_used);
          if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
            ++counts->compound_type[bsize][mbmi->interinter_comp.type -
                                           COMPOUND_WEDGE];
#endif
            update_cdf(fc->compound_type_cdf[bsize],
                       mbmi->interinter_comp.type - COMPOUND_WEDGE,
                       MASKED_COMPOUND_TYPES);
          }
        }
      }
      if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
        if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->wedge_idx[bsize][mbmi->interinter_comp.wedge_index]++;
#endif
          update_cdf(fc->wedge_idx_cdf[bsize],
                     mbmi->interinter_comp.wedge_index, 16);
        }
      }
    }
  }

  if (inter_block && cm->features.interp_filter == SWITCHABLE &&
      av1_is_interp_needed(xd)) {
    update_filter_type_cdf(xd, mbmi, cm->seq_params->enable_dual_filter);
  }
  if (inter_block &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    const PREDICTION_MODE mode = mbmi->mode;
    const int16_t mode_ctx =
        av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);
    if (has_second_ref(mbmi)) {
#if CONFIG_ENTROPY_STATS
      ++counts->inter_compound_mode[mode_ctx][INTER_COMPOUND_OFFSET(mode)];
#endif
      update_cdf(fc->inter_compound_mode_cdf[mode_ctx],
                 INTER_COMPOUND_OFFSET(mode), INTER_COMPOUND_MODES);
    } else {
      av1_update_inter_mode_stats(fc, counts, mode, mode_ctx);
    }

    const int new_mv = mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV;
    if (new_mv) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 0; idx < 2; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx];
#endif
          if (mbmi->ref_mv_idx == idx) break;
        }
      }
    }

    if (have_nearmv_in_inter_mode(mbmi->mode)) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 1; idx < 3; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx - 1, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx - 1];
#endif
          if (mbmi->ref_mv_idx == idx - 1) break;
        }
      }
    }
    if (have_newmv_in_inter_mode(mbmi->mode)) {
      const int allow_hp = cm->features.cur_frame_force_integer_mv
                               ? MV_SUBPEL_NONE
                               : cm->features.allow_high_precision_mv;
      if (new_mv) {
        for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
          const int_mv ref_mv = av1_get_ref_mv(x, ref);
          av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                              allow_hp);
        }
      } else if (mbmi->mode == NEAREST_NEWMV || mbmi->mode == NEAR_NEWMV) {
        const int ref = 1;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      } else if (mbmi->mode == NEW_NEARESTMV || mbmi->mode == NEW_NEARMV) {
        const int ref = 0;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      }
    }
  }
}